

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock.cc
# Opt level: O0

void fdb_load_inmem_stale_info(fdb_kvs_handle *handle)

{
  bool bVar1;
  btree_result bVar2;
  long in_RDI;
  bool expected;
  docio_object doc;
  filemgr *file;
  btree_result br;
  btree_iterator bit;
  filemgr_header_revnum_t _revnum;
  filemgr_header_revnum_t revnum;
  bid_t prev_offset;
  bid_t _offset;
  bid_t offset;
  int64_t ret;
  uint8_t keybuf [64];
  __atomic_val_t<bool> *in_stack_fffffffffffffe98;
  btree_iterator *in_stack_fffffffffffffea0;
  btreeblk_handle *in_stack_fffffffffffffea8;
  btree_iterator *in_stack_fffffffffffffeb0;
  undefined1 local_138 [24];
  undefined1 *local_120;
  ulong *local_108;
  undefined8 *puVar3;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar4;
  docio_object *in_stack_ffffffffffffff10;
  filemgr_header_revnum_t in_stack_ffffffffffffff18;
  fdb_kvs_handle *in_stack_ffffffffffffff20;
  ulong local_88;
  ulong local_70;
  btree_iterator *local_68;
  fdb_status local_60;
  undefined1 read_on_cache_miss;
  docio_object *in_stack_ffffffffffffffa8;
  uint64_t in_stack_ffffffffffffffb0;
  docio_handle *in_stack_ffffffffffffffb8;
  
  puVar3 = *(undefined8 **)(in_RDI + 0x48);
  docio_object::docio_object((docio_object *)in_stack_fffffffffffffea0);
  bVar1 = std::atomic_compare_exchange_strong<bool>
                    ((atomic<bool> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,false);
  if (bVar1) {
    filemgr_mutex_lock((filemgr *)0x1667ae);
    btree_iterator_init(&in_stack_fffffffffffffeb0->btree,
                        (btree_iterator *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    while( true ) {
      bVar2 = btree_next(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         in_stack_fffffffffffffea0);
      btreeblk_end(in_stack_fffffffffffffea8);
      if (bVar2 != BTREE_RESULT_SUCCESS) break;
      local_68 = (btree_iterator *)
                 (local_70 >> 0x38 | (local_70 & 0xff000000000000) >> 0x28 |
                  (local_70 & 0xff0000000000) >> 0x18 | (local_70 & 0xff00000000) >> 8 |
                  (local_70 & 0xff000000) << 8 | (local_70 & 0xff0000) << 0x18 |
                  (local_70 & 0xff00) << 0x28 | local_70 << 0x38);
      uVar4 = 0;
      while (read_on_cache_miss = (undefined1)((ulong)_local_60 >> 0x38),
            local_68 != (btree_iterator *)0xffffffffffffffff) {
        memset(local_138,0,0x38);
        local_120 = &stack0xffffffffffffffa8;
        _local_60 = (fdb_status)
                    docio_read_doc(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                   in_stack_ffffffffffffffa8,(bool)read_on_cache_miss);
        if ((long)_local_60 < 1) {
          in_stack_fffffffffffffea0 = (btree_iterator *)*puVar3;
          in_stack_fffffffffffffea8 =
               (btreeblk_handle *)
               (local_88 >> 0x38 | (local_88 & 0xff000000000000) >> 0x28 |
                (local_88 & 0xff0000000000) >> 0x18 | (local_88 & 0xff00000000) >> 8 |
                (local_88 & 0xff000000) << 8 | (local_88 & 0xff0000) << 0x18 |
                (local_88 & 0xff00) << 0x28 | local_88 << 0x38);
          in_stack_fffffffffffffeb0 = local_68;
          fdb_log_impl((err_log_callback *)0x0,2,(fdb_status)((ulong)_local_60 & 0xffffffff),
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/staleblock.cc"
                       ,"fdb_load_inmem_stale_info",0xba,
                       "Error in reading a stale region info document from a database file \'%s\': revnum %lu, offset %lu\n"
                      );
          local_68 = (btree_iterator *)0xffffffffffffffff;
        }
        else {
          fdb_add_inmem_stale_info
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                     CONCAT44(uVar4,in_stack_ffffffffffffff08),SUB81((ulong)puVar3 >> 0x38,0));
          local_70 = *local_108;
          local_68 = (btree_iterator *)
                     (local_70 >> 0x38 | (local_70 & 0xff000000000000) >> 0x28 |
                      (local_70 & 0xff0000000000) >> 0x18 | (local_70 & 0xff00000000) >> 8 |
                      (local_70 & 0xff000000) << 8 | (local_70 & 0xff0000) << 0x18 |
                      (local_70 & 0xff00) << 0x28 | local_70 << 0x38);
          free(local_108);
        }
      }
    }
    btree_iterator_free(in_stack_fffffffffffffea0);
    filemgr_mutex_unlock((filemgr *)0x166b99);
  }
  return;
}

Assistant:

void fdb_load_inmem_stale_info(fdb_kvs_handle *handle)
{
    uint8_t keybuf[64];
    int64_t ret;
    bid_t offset, _offset, prev_offset;
    filemgr_header_revnum_t revnum, _revnum;
    btree_iterator bit;
    btree_result br;
    struct filemgr *file = handle->file;
    struct docio_object doc;
    bool expected = false;

    if (!std::atomic_compare_exchange_strong(&file->stale_info_tree_loaded,
                                             &expected, true)) {
        // stale info is already loaded (fast screening without mutex)
        return;
    }

    // first open of the DB file
    // should grab mutex to avoid race with other writer
    filemgr_mutex_lock(file);

    btree_iterator_init(handle->staletree, &bit, NULL);
    do {
        br = btree_next(&bit, (void*)&_revnum, (void*)&_offset);
        btreeblk_end(handle->bhandle);
        if (br != BTREE_RESULT_SUCCESS) {
            break;
        }

        revnum = _endian_decode(_revnum);
        offset = _endian_decode(_offset);

        while (offset != BLK_NOT_FOUND) {
            memset(&doc, 0x0, sizeof(doc));
            // pre-allocated buffer for key
            doc.key = (void*)keybuf;

            ret = docio_read_doc(handle->dhandle, offset, &doc, true);
            if (ret <= 0) {
                // read fail .. escape
                fdb_log(NULL, FDB_LOG_ERROR, (fdb_status)ret,
                        "Error in reading a stale region info document "
                        "from a database file '%s'"
                        ": revnum %" _F64 ", offset %" _F64 "\n",
                        file->filename, revnum, offset);
                offset = BLK_NOT_FOUND;
                continue;
            }

            fdb_add_inmem_stale_info(handle, revnum, &doc, offset, false);

            // fetch previous doc offset
            memcpy(&_offset, doc.body, sizeof(_offset));
            prev_offset = _endian_decode(_offset);

            // We don't need to free 'meta' as it will be NULL.
            free(doc.body);

            offset = prev_offset;
        }
    } while (true);
    btree_iterator_free(&bit);

    filemgr_mutex_unlock(file);
}